

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::initGame(Fifteen *this)

{
  QGroupBox *pQVar1;
  pointer pMVar2;
  pointer this_00;
  QWidget *this_01;
  QHBoxLayout *this_02;
  pointer this_03;
  QGroupBox *pQVar3;
  _Invoker_type *pp_Var4;
  QFlags<Qt::AlignmentFlag> local_40c;
  QGroupBox *local_408;
  QGroupBox *boxImages;
  QHBoxLayout *mainLayout;
  QWidget *local_3f0;
  QWidget *mainPanel;
  QVBoxLayout *layout;
  code *local_3d8;
  undefined8 local_3d0;
  type local_3c8;
  Fifteen *local_3b0;
  code *local_3a8;
  undefined8 local_3a0;
  type local_398;
  Fifteen *local_380;
  code *local_378;
  undefined8 local_370;
  type local_368;
  function<void()> *local_350;
  undefined1 local_348 [8];
  array<std::function<void_()>,_3UL> panelSlots;
  QMenuBar *menu;
  Fifteen *local_2c8;
  code *local_2c0;
  undefined8 local_2b8;
  type local_2b0;
  function<void_()> local_298;
  QString local_278;
  Fifteen *local_260;
  code *local_258;
  undefined8 local_250;
  type local_248;
  function<void_()> local_230;
  QString local_210;
  Fifteen *local_1f8;
  code *local_1f0;
  undefined8 local_1e8;
  type local_1e0;
  function<void_()> local_1c8;
  QString local_1a8;
  Fifteen *local_190;
  code *local_188;
  undefined8 local_180;
  type local_178;
  function<void_()> local_160;
  QString local_140;
  Fifteen *local_128;
  code *local_120;
  undefined8 local_118;
  type local_110;
  function<void_()> local_f8;
  QString local_c8;
  Fifteen *local_b0;
  code *local_a8;
  undefined8 local_a0;
  type local_98;
  function<void_()> local_80;
  unique_ptr<MenuBar,_std::default_delete<MenuBar>_> local_60;
  unique_ptr<Panel,_std::default_delete<Panel>_> local_58;
  Fifteen *local_50;
  code *local_48;
  undefined8 local_40;
  type local_38;
  undefined1 local_20 [16];
  _Head_base<0UL,_Fifteen_*,_false> local_10;
  Fifteen *this_local;
  
  local_10._M_head_impl = this;
  QWidget::resize((QWidget *)this,0x352,600);
  std::make_unique<Controller>();
  std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator=
            (&this->controller,
             (unique_ptr<Controller,_std::default_delete<Controller>_> *)(local_20 + 8));
  std::unique_ptr<Controller,_std::default_delete<Controller>_>::~unique_ptr
            ((unique_ptr<Controller,_std::default_delete<Controller>_> *)(local_20 + 8));
  local_48 = pressTile;
  local_40 = 0;
  local_50 = this;
  std::bind<void(Fifteen::*)(),Fifteen*>(&local_38,(offset_in_Fifteen_to_subr *)&local_48,&local_50)
  ;
  std::make_unique<TilesBoard,std::_Bind<void(Fifteen::*(Fifteen*))()>>
            ((_Bind<void_(Fifteen::*(Fifteen_*))()> *)local_20);
  std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::operator=
            (&this->tilesBoard,(unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_> *)local_20)
  ;
  std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::~unique_ptr
            ((unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_> *)local_20);
  std::make_unique<Panel>();
  std::unique_ptr<Panel,_std::default_delete<Panel>_>::operator=(&this->panel,&local_58);
  std::unique_ptr<Panel,_std::default_delete<Panel>_>::~unique_ptr(&local_58);
  std::make_unique<MenuBar>();
  std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator=(&this->menuBar,&local_60);
  std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::~unique_ptr(&local_60);
  pMVar2 = std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator->(&this->menuBar);
  local_a8 = slotLoadGraphic;
  local_a0 = 0;
  local_b0 = this;
  std::bind<void(Fifteen::*)(),Fifteen*>(&local_98,(offset_in_Fifteen_to_subr *)&local_a8,&local_b0)
  ;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_80,&local_98);
  QString::QString(&local_c8,"Load Graphic File");
  MenuBar::bindSlot(pMVar2,OPEN_GRAPHIC,&local_80,&this->super_QMainWindow,&local_c8);
  QString::~QString(&local_c8);
  std::function<void_()>::~function(&local_80);
  pMVar2 = std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator->(&this->menuBar);
  local_120 = slotRemoveGraphic;
  local_118 = 0;
  local_128 = this;
  std::bind<void(Fifteen::*)(),Fifteen*>
            (&local_110,(offset_in_Fifteen_to_subr *)&local_120,&local_128);
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_f8,&local_110);
  QString::QString(&local_140,"Remove Graphic");
  MenuBar::bindSlot(pMVar2,REM_GRAPHIC,&local_f8,&this->super_QMainWindow,&local_140);
  QString::~QString(&local_140);
  std::function<void_()>::~function(&local_f8);
  pMVar2 = std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator->(&this->menuBar);
  local_188 = slotSaveBoard;
  local_180 = 0;
  local_190 = this;
  std::bind<void(Fifteen::*)(),Fifteen*>
            (&local_178,(offset_in_Fifteen_to_subr *)&local_188,&local_190);
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_160,&local_178);
  QString::QString(&local_1a8,"Save Board");
  MenuBar::bindSlot(pMVar2,SAVE_BOARD,&local_160,&this->super_QMainWindow,&local_1a8);
  QString::~QString(&local_1a8);
  std::function<void_()>::~function(&local_160);
  pMVar2 = std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator->(&this->menuBar);
  local_1f0 = slotReadBoard;
  local_1e8 = 0;
  local_1f8 = this;
  std::bind<void(Fifteen::*)(),Fifteen*>
            (&local_1e0,(offset_in_Fifteen_to_subr *)&local_1f0,&local_1f8);
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_1c8,&local_1e0);
  QString::QString(&local_210,"Load Board");
  MenuBar::bindSlot(pMVar2,LOAD_BOARD,&local_1c8,&this->super_QMainWindow,&local_210);
  QString::~QString(&local_210);
  std::function<void_()>::~function(&local_1c8);
  pMVar2 = std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator->(&this->menuBar);
  local_258 = slotSettings;
  local_250 = 0;
  local_260 = this;
  std::bind<void(Fifteen::*)(),Fifteen*>
            (&local_248,(offset_in_Fifteen_to_subr *)&local_258,&local_260);
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_230,&local_248);
  QString::QString(&local_278,"Settings");
  MenuBar::bindSlot(pMVar2,SETTINGS,&local_230,&this->super_QMainWindow,&local_278);
  QString::~QString(&local_278);
  std::function<void_()>::~function(&local_230);
  pMVar2 = std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator->(&this->menuBar);
  local_2c0 = slotAbout;
  local_2b8 = 0;
  local_2c8 = this;
  std::bind<void(Fifteen::*)(),Fifteen*>
            (&local_2b0,(offset_in_Fifteen_to_subr *)&local_2c0,&local_2c8);
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_298,&local_2b0);
  QString::QString((QString *)&menu,"About");
  MenuBar::bindSlot(pMVar2,ABOUT,&local_298,&this->super_QMainWindow,(QString *)&menu);
  QString::~QString((QString *)&menu);
  std::function<void_()>::~function(&local_298);
  pMVar2 = std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator->(&this->menuBar);
  panelSlots._M_elems[2]._M_invoker =
       (_Invoker_type)MenuBar::createMenuBar(pMVar2,&this->super_QMainWindow);
  QMainWindow::setMenuBar((QMenuBar *)this);
  local_378 = slotGenerateBoard;
  local_370 = 0;
  local_380 = this;
  local_350 = (function<void()> *)local_348;
  std::bind<void(Fifteen::*)(),Fifteen*>
            (&local_368,(offset_in_Fifteen_to_subr *)&local_378,&local_380);
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)local_348,&local_368);
  pp_Var4 = &panelSlots._M_elems[0]._M_invoker;
  local_3a8 = slotSolveBoard;
  local_3a0 = 0;
  local_3b0 = this;
  local_350 = (function<void()> *)pp_Var4;
  std::bind<void(Fifteen::*)(),Fifteen*>
            (&local_398,(offset_in_Fifteen_to_subr *)&local_3a8,&local_3b0);
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)pp_Var4,&local_398);
  pp_Var4 = &panelSlots._M_elems[1]._M_invoker;
  local_3d8 = slotUndoMove;
  local_3d0 = 0;
  layout = (QVBoxLayout *)this;
  local_350 = (function<void()> *)pp_Var4;
  std::bind<void(Fifteen::*)(),Fifteen*>
            (&local_3c8,(offset_in_Fifteen_to_subr *)&local_3d8,(Fifteen **)&layout);
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)pp_Var4,&local_3c8);
  this_00 = std::unique_ptr<Panel,_std::default_delete<Panel>_>::operator->(&this->panel);
  mainPanel = (QWidget *)
              Panel::createLayout(this_00,(array<std::function<void_()>,_3UL> *)local_348,
                                  &this->super_QMainWindow);
  this_01 = (QWidget *)operator_new(0x28);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)((long)&mainLayout + 4));
  QWidget::QWidget(this_01,(QWidget *)this,(QFlags_conflict *)(ulong)mainLayout._4_4_);
  local_3f0 = this_01;
  QWidget::setContentsMargins((int)this_01,0x14,0x14,0);
  this_02 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_02,local_3f0);
  boxImages = (QGroupBox *)this_02;
  this_03 = std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::operator->
                      (&this->tilesBoard);
  pQVar3 = TilesBoard::createGroupBox(this_03);
  pQVar1 = boxImages;
  local_408 = pQVar3;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_40c);
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pQVar3,(QFlags_conflict *)0x0);
  QBoxLayout::addLayout((QLayout *)boxImages,(int)mainPanel);
  QMainWindow::setCentralWidget((QWidget *)this);
  redrawTiles(this);
  std::array<std::function<void_()>,_3UL>::~array((array<std::function<void_()>,_3UL> *)local_348);
  return;
}

Assistant:

void Fifteen::initGame()
{
    resize( 850, 600 );
    controller = std::make_unique<Controller>();
    tilesBoard = std::make_unique<TilesBoard>( std::bind( &Fifteen::pressTile, this ));
    panel = std::make_unique<Panel>();

    menuBar = std::make_unique<MenuBar>();
    menuBar->bindSlot( ActionMenu::OPEN_GRAPHIC, std::bind( &Fifteen::slotLoadGraphic, this ), this, "Load Graphic File" );
    menuBar->bindSlot( ActionMenu::REM_GRAPHIC, std::bind( &Fifteen::slotRemoveGraphic, this ), this, "Remove Graphic" );
    menuBar->bindSlot( ActionMenu::SAVE_BOARD, std::bind( &Fifteen::slotSaveBoard, this ), this, "Save Board" );
    menuBar->bindSlot( ActionMenu::LOAD_BOARD, std::bind( &Fifteen::slotReadBoard, this ), this, "Load Board" );
    menuBar->bindSlot( ActionMenu::SETTINGS, std::bind( &Fifteen::slotSettings, this ), this, "Settings" );
    menuBar->bindSlot( ActionMenu::ABOUT, std::bind( &Fifteen::slotAbout, this ), this, "About" );

    QMenuBar* menu = menuBar->createMenuBar( this );
    setMenuBar( menu );

    std::array<std::function<void( void )>, 3> panelSlots =
    {
        std::bind( &Fifteen::slotGenerateBoard, this ),
        std::bind( &Fifteen::slotSolveBoard, this ),
        std::bind( &Fifteen::slotUndoMove, this ),
    };
    QVBoxLayout* layout = panel->createLayout( panelSlots, this );

    QWidget* mainPanel = new QWidget( this );
    mainPanel->setContentsMargins( 20, 20, 0, 20 );

    QHBoxLayout* mainLayout = new QHBoxLayout( mainPanel );
    QGroupBox* boxImages = tilesBoard->createGroupBox();
    mainLayout->addWidget( boxImages );
    mainLayout->addLayout( layout );
    setCentralWidget( mainPanel );

    redrawTiles();
}